

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::
format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
::get_arg(format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
          *this,int id)

{
  long in_RDI;
  undefined4 local_38;
  int in_stack_ffffffffffffffcc;
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>
  *in_stack_ffffffffffffffd0;
  undefined4 local_28;
  
  internal::
  get_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  *(ulong *)(in_RDI + 0x50) = CONCAT44(in_stack_ffffffffffffffcc,local_38);
  *(basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t> **
   )(in_RDI + 0x58) = in_stack_ffffffffffffffd0;
  *(undefined4 *)(in_RDI + 0x60) = local_28;
  return;
}

Assistant:

void get_arg(int id) { arg = internal::get_arg(context, id); }